

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O3

void __thiscall
LocalGraphTest_ObstacleUnreachable_Test::TestBody(LocalGraphTest_ObstacleUnreachable_Test *this)

{
  Export *pEVar1;
  ulong uVar2;
  undefined8 *puVar3;
  LocalSet *set;
  SetInfluences *pSVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_600 [8];
  Module wasm;
  LazyLocalGraph graph;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  char local_1f0;
  long *local_a0 [2];
  long local_90 [2];
  char local_80;
  uint local_74;
  undefined1 local_70 [8];
  Type local_68;
  AssertHelperData *local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  
  ::wasm::Module::Module((Module *)local_600);
  local_80 = '\0';
  ::wasm::WATParser::parseModule
            (&wasm.tagsMap._M_h._M_single_bucket,(Module *)local_600,0x107,
             "\n    (module\n      (func $foo (result i32)\n        ;; An unreachable between the set and get.\n        (local $x i32)\n        (local.set $x\n          (i32.const 10)\n        )\n        (nop)\n        (unreachable)\n        (nop)\n        (local.get $x)\n      )\n    )\n  "
             ,local_a0);
  local_70[0] = (internal)(local_1f0 != '\x01');
  local_68.id = 0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&wasm.tagsMap._M_h._M_single_bucket);
  if (local_80 == '\x01') {
    local_80 = '\0';
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,(internal *)local_70,
               (AssertionResult *)"WATParser::parseModule(wasm, moduleText).getErr()","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
               ,0x74,(char *)wasm.tagsMap._M_h._M_single_bucket);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wasm.tagsMap._M_h._M_single_bucket != &local_200) {
      operator_delete(wasm.tagsMap._M_h._M_single_bucket,local_200._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id)
      ;
    }
LAB_001a7ef3:
    ::wasm::Module::~Module((Module *)local_600);
    return;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id);
  }
  pEVar1 = ((wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  pcVar5 = *(char **)(pEVar1 + 0x60);
  if (*pcVar5 == '\x01') {
    uVar2 = *(ulong *)(pcVar5 + 0x28);
    if (uVar2 == 0) {
LAB_001a7f0d:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    puVar3 = *(undefined8 **)(pcVar5 + 0x20);
    set = (LocalSet *)*puVar3;
    if ((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id == LocalSetId)
    {
      if (uVar2 == 1) goto LAB_001a7f0d;
      if (*(char *)puVar3[1] == '\x16') {
        if (uVar2 < 4) goto LAB_001a7f0d;
        if (*(char *)puVar3[3] == '\x16') {
          ::wasm::LazyLocalGraph::LazyLocalGraph
                    ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,pEVar1,local_600,0x116);
          pSVar4 = ::wasm::LazyLocalGraph::getSetInfluences
                             ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,set);
          local_38._M_head_impl =
               *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (pSVar4 + 0x18);
          local_28.data_ = (AssertHelperData *)((ulong)local_28.data_._4_4_ << 0x20);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                    ((internal *)local_70,"graph.getSetInfluences(set).size()","0U",
                     (unsigned_long *)&local_38,(uint *)&local_28);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_38);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)local_68.id;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                       ,0x7d,pcVar5);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            if (local_38._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_38._M_head_impl + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.id !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68.id);
          }
          ::wasm::LazyLocalGraph::canMoveSet
                    ((LocalSet *)local_70,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
          local_28.data_ = local_58;
          local_74 = 0;
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                    ((internal *)&local_38,"graph.canMoveSet(set, nopA).size()","0U",
                     (unsigned_long *)&local_28,&local_74);
          std::
          _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_70);
          if (local_38._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_70);
            if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_30->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                       ,0x7e,pcVar5);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            if ((long *)CONCAT71(local_70._1_7_,local_70[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_70._1_7_,local_70[0]) + 8))();
            }
          }
          if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_30,local_30);
          }
          ::wasm::LazyLocalGraph::canMoveSet
                    ((LocalSet *)local_70,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
          local_28.data_ = local_58;
          local_74 = 0;
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                    ((internal *)&local_38,"graph.canMoveSet(set, nopB).size()","0U",
                     (unsigned_long *)&local_28,&local_74);
          std::
          _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_70);
          if (local_38._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_70);
            if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_30->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                       ,0x7f,pcVar5);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            if ((long *)CONCAT71(local_70._1_7_,local_70[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_70._1_7_,local_70[0]) + 8))();
            }
          }
          if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_30,local_30);
          }
          ::wasm::LazyLocalGraph::~LazyLocalGraph
                    ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket);
          goto LAB_001a7ef3;
        }
      }
      pcVar5 = "T *wasm::Expression::cast() [T = wasm::Nop]";
    }
    else {
      pcVar5 = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
    }
  }
  else {
    pcVar5 = "T *wasm::Expression::cast() [T = wasm::Block]";
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,pcVar5);
}

Assistant:

TEST_F(LocalGraphTest, ObstacleUnreachable) {
  auto moduleText = R"wasm(
    (module
      (func $foo (result i32)
        ;; An unreachable between the set and get.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (nop)
        (unreachable)
        (nop)
        (local.get $x)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // The get is unreachable, and the set has no gets.
  EXPECT_EQ(graph.getSetInfluences(set).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 0U);
}